

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HdmiCecAnalyzerResults.cpp
# Opt level: O1

void __thiscall HdmiCecAnalyzerResults::GenACKBubble(HdmiCecAnalyzerResults *this,Frame *frame)

{
  long lVar1;
  char *pcVar2;
  long *plVar3;
  long *plVar4;
  char *pcVar5;
  long *local_58;
  long local_50;
  long local_48;
  long lStack_40;
  undefined1 *local_38 [2];
  undefined1 local_28 [16];
  
  lVar1 = *(long *)(frame + 0x10);
  if (this->mTabular == false) {
    local_58 = &local_48;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"A","");
    AnalyzerResults::AddResultString
              ((char *)this,(char *)local_58,(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    if (local_58 != &local_48) {
      operator_delete(local_58);
    }
    pcVar5 = "A=1";
    if (lVar1 == 0) {
      pcVar5 = "A=0";
    }
    pcVar2 = "A=1";
    if (lVar1 == 0) {
      pcVar2 = "A=0";
    }
    local_58 = &local_48;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,pcVar5,pcVar2 + 3);
    AnalyzerResults::AddResultString
              ((char *)this,(char *)local_58,(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    if (local_58 != &local_48) {
      operator_delete(local_58);
    }
    pcVar5 = "ACK=1";
    if (lVar1 == 0) {
      pcVar5 = "ACK=0";
    }
    pcVar2 = "ACK=1";
    if (lVar1 == 0) {
      pcVar2 = "ACK=0";
    }
    local_58 = &local_48;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,pcVar5,pcVar2 + 5);
    AnalyzerResults::AddResultString
              ((char *)this,(char *)local_58,(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    if (local_58 != &local_48) {
      operator_delete(local_58);
    }
  }
  pcVar5 = "A=1";
  if (lVar1 == 0) {
    pcVar5 = "A=0";
  }
  pcVar2 = "A=1";
  if (lVar1 == 0) {
    pcVar2 = "A=0";
  }
  local_38[0] = local_28;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_38,pcVar5 + 2,pcVar2 + 3);
  plVar3 = (long *)std::__cxx11::string::replace((ulong)local_38,0,(char *)0x0,0x10b0fb);
  plVar4 = plVar3 + 2;
  if ((long *)*plVar3 == plVar4) {
    local_48 = *plVar4;
    lStack_40 = plVar3[3];
    local_58 = &local_48;
  }
  else {
    local_48 = *plVar4;
    local_58 = (long *)*plVar3;
  }
  local_50 = plVar3[1];
  *plVar3 = (long)plVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  AnalyzerResults::AddResultString
            ((char *)this,(char *)local_58,(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
  if (local_58 != &local_48) {
    operator_delete(local_58);
  }
  if (local_38[0] != local_28) {
    operator_delete(local_38[0]);
  }
  return;
}

Assistant:

void HdmiCecAnalyzerResults::GenACKBubble( const Frame& frame )
{
    bool ack = frame.mData1;

    if( !mTabular )
    {
        AddResult( "A" );
        AddResult( ack ? "A=1" : "A=0" );
        AddResult( ack ? "ACK=1" : "ACK=0" );
    }
    AddResult( "Acknowledgment = " + std::string( ack ? "1" : "0" ) );
}